

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CasePropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CasePropertyExprSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::PropertyCaseItemSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          SyntaxList<slang::syntax::PropertyCaseItemSyntax> *args_4,Token *args_5)

{
  size_type sVar1;
  pointer ppPVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  TokenKind TVar15;
  undefined1 uVar16;
  NumericTokenFlags NVar17;
  uint32_t uVar18;
  SyntaxKind SVar19;
  undefined4 uVar20;
  TokenKind TVar21;
  undefined1 uVar22;
  NumericTokenFlags NVar23;
  uint32_t uVar24;
  CasePropertyExprSyntax *pCVar25;
  long lVar26;
  
  pCVar25 = (CasePropertyExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CasePropertyExprSyntax *)this->endPtr < pCVar25 + 1) {
    pCVar25 = (CasePropertyExprSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pCVar25 + 1);
  }
  TVar7 = args->kind;
  uVar8 = args->field_0x2;
  NVar9.raw = (args->numFlags).raw;
  uVar10 = args->rawLen;
  pIVar3 = args->info;
  TVar11 = args_1->kind;
  uVar12 = args_1->field_0x2;
  NVar13.raw = (args_1->numFlags).raw;
  uVar14 = args_1->rawLen;
  pIVar4 = args_1->info;
  TVar15 = args_3->kind;
  uVar16 = args_3->field_0x2;
  NVar17.raw = (args_3->numFlags).raw;
  uVar18 = args_3->rawLen;
  pIVar5 = args_3->info;
  TVar21 = args_5->kind;
  uVar22 = args_5->field_0x2;
  NVar23.raw = (args_5->numFlags).raw;
  uVar24 = args_5->rawLen;
  pIVar6 = args_5->info;
  (pCVar25->super_PropertyExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar25->super_PropertyExprSyntax).super_SyntaxNode.kind = CasePropertyExpr;
  (pCVar25->caseKeyword).kind = TVar7;
  (pCVar25->caseKeyword).field_0x2 = uVar8;
  (pCVar25->caseKeyword).numFlags = (NumericTokenFlags)NVar9.raw;
  (pCVar25->caseKeyword).rawLen = uVar10;
  (pCVar25->caseKeyword).info = pIVar3;
  (pCVar25->openParen).kind = TVar11;
  (pCVar25->openParen).field_0x2 = uVar12;
  (pCVar25->openParen).numFlags = (NumericTokenFlags)NVar13.raw;
  (pCVar25->openParen).rawLen = uVar14;
  (pCVar25->openParen).info = pIVar4;
  (pCVar25->expr).ptr = args_2;
  (pCVar25->closeParen).kind = TVar15;
  (pCVar25->closeParen).field_0x2 = uVar16;
  (pCVar25->closeParen).numFlags = (NumericTokenFlags)NVar17.raw;
  (pCVar25->closeParen).rawLen = uVar18;
  (pCVar25->closeParen).info = pIVar5;
  SVar19 = (args_4->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar20 = *(undefined4 *)&(args_4->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pCVar25->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (args_4->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar25->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar19;
  *(undefined4 *)&(pCVar25->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar20;
  (pCVar25->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (pCVar25->items).super_SyntaxListBase.childCount = (args_4->super_SyntaxListBase).childCount;
  sVar1 = (args_4->super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>).
          size_;
  (pCVar25->items).super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>.data_
       = (args_4->super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>).data_
  ;
  (pCVar25->items).super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>.size_
       = sVar1;
  (pCVar25->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004ecf90;
  (pCVar25->endcase).kind = TVar21;
  (pCVar25->endcase).field_0x2 = uVar22;
  (pCVar25->endcase).numFlags = (NumericTokenFlags)NVar23.raw;
  (pCVar25->endcase).rawLen = uVar24;
  (pCVar25->endcase).info = pIVar6;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pCVar25;
  (pCVar25->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pCVar25;
  sVar1 = (pCVar25->items).
          super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppPVar2 = (pCVar25->items).
              super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>.data_;
    lVar26 = 0;
    do {
      **(undefined8 **)((long)ppPVar2 + lVar26) = pCVar25;
      lVar26 = lVar26 + 8;
    } while (sVar1 << 3 != lVar26);
  }
  return pCVar25;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }